

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O0

int llvm::readExponent(iterator begin,iterator end)

{
  char cVar1;
  uint uVar2;
  bool bVar3;
  char *pcStack_38;
  uint value;
  iterator p;
  uint local_28;
  uint overlargeExponent;
  uint absExponent;
  bool isNegative;
  iterator end_local;
  iterator begin_local;
  
  if (begin == end) {
    __assert_fail("p != end && \"Exponent has no digits\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                  ,0xca,"int llvm::readExponent(StringRef::iterator, StringRef::iterator)");
  }
  cVar1 = *begin;
  if (((*begin == '-') || (pcStack_38 = begin, *begin == '+')) &&
     (pcStack_38 = begin + 1, pcStack_38 == end)) {
    __assert_fail("p != end && \"Exponent has no digits\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                  ,0xcf,"int llvm::readExponent(StringRef::iterator, StringRef::iterator)");
  }
  local_28 = decDigitValue((int)*pcStack_38);
  if (9 < local_28) {
    __assert_fail("absExponent < 10U && \"Invalid character in exponent\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                  ,0xd3,"int llvm::readExponent(StringRef::iterator, StringRef::iterator)");
  }
  do {
    pcStack_38 = pcStack_38 + 1;
    if (pcStack_38 == end) goto LAB_001b3c53;
    uVar2 = decDigitValue((int)*pcStack_38);
    if (9 < uVar2) {
      __assert_fail("value < 10U && \"Invalid character in exponent\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                    ,0xd9,"int llvm::readExponent(StringRef::iterator, StringRef::iterator)");
    }
    bVar3 = local_28 < 24000;
    local_28 = local_28 * 10 + uVar2;
  } while (bVar3);
  local_28 = 24000;
  pcStack_38 = end;
LAB_001b3c53:
  if (pcStack_38 == end) {
    if (cVar1 == '-') {
      begin_local._4_4_ = -local_28;
    }
    else {
      begin_local._4_4_ = local_28;
    }
    return begin_local._4_4_;
  }
  __assert_fail("p == end && \"Invalid exponent in exponent\"",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                ,0xe4,"int llvm::readExponent(StringRef::iterator, StringRef::iterator)");
}

Assistant:

static int
readExponent(StringRef::iterator begin, StringRef::iterator end)
{
  bool isNegative;
  unsigned int absExponent;
  const unsigned int overlargeExponent = 24000;  /* FIXME.  */
  StringRef::iterator p = begin;

  assert(p != end && "Exponent has no digits");

  isNegative = (*p == '-');
  if (*p == '-' || *p == '+') {
    p++;
    assert(p != end && "Exponent has no digits");
  }

  absExponent = decDigitValue(*p++);
  assert(absExponent < 10U && "Invalid character in exponent");

  for (; p != end; ++p) {
    unsigned int value;

    value = decDigitValue(*p);
    assert(value < 10U && "Invalid character in exponent");

    value += absExponent * 10;
    if (absExponent >= overlargeExponent) {
      absExponent = overlargeExponent;
      p = end;  /* outwit assert below */
      break;
    }
    absExponent = value;
  }

  assert(p == end && "Invalid exponent in exponent"); (void)p;

  if (isNegative)
    return -(int) absExponent;
  else
    return (int) absExponent;
}